

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O2

int dwarf_get_fde_list(Dwarf_Debug dbg,Dwarf_Cie_conflict **cie_data,Dwarf_Signed *cie_element_count
                      ,Dwarf_Fde_conflict **fde_data,Dwarf_Signed *fde_element_count,
                      Dwarf_Error *error)

{
  int iVar1;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_fde_list()either null or it containsa stale Dwarf_Debug pointer"
                       );
    iVar1 = 1;
  }
  else {
    iVar1 = _dwarf_load_section(dbg,&dbg->de_debug_frame,error);
    if (iVar1 == 0) {
      iVar1 = _dwarf_get_fde_list_internal
                        (dbg,cie_data,cie_element_count,fde_data,fde_element_count,
                         (dbg->de_debug_frame).dss_data,(dbg->de_debug_frame).dss_index,
                         (dbg->de_debug_frame).dss_size,0xffffffffffffffff,0,error);
    }
  }
  return iVar1;
}

Assistant:

int
dwarf_get_fde_list(Dwarf_Debug dbg,
    Dwarf_Cie ** cie_data,
    Dwarf_Signed * cie_element_count,
    Dwarf_Fde ** fde_data,
    Dwarf_Signed * fde_element_count,
    Dwarf_Error * error)
{
    int res = 0;

    CHECK_DBG(dbg,error,"dwarf_get_fde_list()");
    res = _dwarf_load_section(dbg, &dbg->de_debug_frame,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    res = _dwarf_get_fde_list_internal(dbg, cie_data,
        cie_element_count,
        fde_data,
        fde_element_count,
        dbg->de_debug_frame.dss_data,
        dbg->de_debug_frame.dss_index,
        dbg->de_debug_frame.dss_size,
        (Dwarf_Unsigned)DW_CIE_ID,
        /* use_gnu_cie_calc= */ 0,
        error);

    return res;
}